

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O2

bool __thiscall
Rml::DataModel::BindEventCallback(DataModel *this,String *name,DataEventFunc *event_func)

{
  char *pcVar1;
  pointer pcVar2;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  pStack_38;
  
  pcVar1 = LegalVariableName(name);
  if (pcVar1 == (char *)0x0) {
    if ((event_func->super__Function_base)._M_manager == (_Manager_type)0x0) {
      pcVar2 = (name->_M_dataplus)._M_p;
      pcVar1 = "Could not bind data event callback \'%s\' to data model, empty function provided.";
    }
    else {
      robin_hood::detail::
      Table<true,80ul,std::__cxx11::string,std::function<void(Rml::DataModelHandle,Rml::Event&,std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
      ::
      emplace<std::__cxx11::string_const&,std::function<void(Rml::DataModelHandle,Rml::Event&,std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>>
                (&pStack_38,
                 (Table<true,80ul,std::__cxx11::string,std::function<void(Rml::DataModelHandle,Rml::Event&,std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                  *)&this->event_callbacks,name,event_func);
      if (pStack_38.second != false) {
        return true;
      }
      pcVar2 = (name->_M_dataplus)._M_p;
      pcVar1 = "Data event callback with name \'%s\' already exists.";
    }
    Log::Message(LT_WARNING,pcVar1,pcVar2);
  }
  else {
    Log::Message(LT_WARNING,"Could not bind data event callback \'%s\'. %s",(name->_M_dataplus)._M_p
                 ,pcVar1);
  }
  return false;
}

Assistant:

bool DataModel::BindEventCallback(const String& name, DataEventFunc event_func)
{
	const char* name_error_str = LegalVariableName(name);
	if (name_error_str)
	{
		Log::Message(Log::LT_WARNING, "Could not bind data event callback '%s'. %s", name.c_str(), name_error_str);
		return false;
	}

	if (!event_func)
	{
		Log::Message(Log::LT_WARNING, "Could not bind data event callback '%s' to data model, empty function provided.", name.c_str());
		return false;
	}

	bool inserted = event_callbacks.emplace(name, std::move(event_func)).second;
	if (!inserted)
	{
		Log::Message(Log::LT_WARNING, "Data event callback with name '%s' already exists.", name.c_str());
		return false;
	}

	return true;
}